

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_int16_array
              (coda_cursor_conflict *cursor,int16_t *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  char *pcVar2;
  coda_type *local_48;
  long local_40;
  long i;
  long num_elements;
  coda_type *type;
  coda_native_type read_type;
  coda_array_ordering array_ordering_local;
  int16_t *dst_local;
  coda_cursor_conflict *cursor_local;
  
  type._4_4_ = array_ordering;
  _read_type = dst;
  dst_local = (int16_t *)cursor;
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0xbd6);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (int16_t *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0xbdb);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_48 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_48 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    num_elements = (long)local_48;
    if (local_48->type_class == coda_array_class) {
      iVar1 = get_array_element_read_type(local_48,(coda_native_type *)&type);
      if (iVar1 == 0) {
        if ((coda_native_type)type == coda_native_type_int8) {
          iVar1 = read_int8_array((coda_cursor_conflict *)dst_local,(int8_t *)_read_type,type._4_4_)
          ;
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_get_num_elements((coda_cursor_conflict *)dst_local,&i);
          local_40 = i;
          if (iVar1 != 0) {
            return -1;
          }
          while (local_40 = local_40 + -1, -1 < local_40) {
            _read_type[local_40] = (short)*(char *)((long)_read_type + local_40);
          }
        }
        else if ((coda_native_type)type == coda_native_type_uint8) {
          iVar1 = read_uint8_array((coda_cursor_conflict *)dst_local,(uint8_t *)_read_type,
                                   type._4_4_);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_get_num_elements((coda_cursor_conflict *)dst_local,&i);
          local_40 = i;
          if (iVar1 != 0) {
            return -1;
          }
          while (local_40 = local_40 + -1, -1 < local_40) {
            _read_type[local_40] = (ushort)*(byte *)((long)_read_type + local_40);
          }
        }
        else {
          if ((coda_native_type)type != coda_native_type_int16) {
            pcVar2 = coda_type_get_native_type_name((coda_native_type)type);
            coda_set_error(-0x69,"can not read %s data using a int16 data type",pcVar2);
            return -1;
          }
          iVar1 = read_int16_array((coda_cursor_conflict *)dst_local,_read_type,type._4_4_);
          if (iVar1 != 0) {
            return -1;
          }
        }
        cursor_local._4_4_ = 0;
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      pcVar2 = coda_type_get_class_name(local_48->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar2);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_int16_array(const coda_cursor *cursor, int16_t *dst,
                                             coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;
    long num_elements;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_array(cursor, (int8_t *)dst, array_ordering) != 0)
            {
                return -1;
            }
            if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
            {
                return -1;
            }
            for (i = num_elements - 1; i >= 0; i--)
            {
                dst[i] = (int16_t)((int8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint8:
            if (read_uint8_array(cursor, (uint8_t *)dst, array_ordering) != 0)
            {
                return -1;
            }
            if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
            {
                return -1;
            }
            for (i = num_elements - 1; i >= 0; i--)
            {
                dst[i] = (int16_t)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_int16:
            if (read_int16_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int16 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}